

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O1

TransposeLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_transpose(NeuralNetworkLayer *this)

{
  TransposeLayerParams *this_00;
  
  if (this->_oneof_case_[0] != 0x3d9) {
    clear_layer(this);
    this->_oneof_case_[0] = 0x3d9;
    this_00 = (TransposeLayerParams *)operator_new(0x28);
    TransposeLayerParams::TransposeLayerParams(this_00);
    (this->layer_).transpose_ = this_00;
  }
  return (TransposeLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::TransposeLayerParams* NeuralNetworkLayer::mutable_transpose() {
  if (!has_transpose()) {
    clear_layer();
    set_has_transpose();
    layer_.transpose_ = new ::CoreML::Specification::TransposeLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.transpose)
  return layer_.transpose_;
}